

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::SwapField
          (Reflection *this,Message *message1,Message *message2,FieldDescriptor *field)

{
  undefined8 uVar1;
  undefined1 uVar2;
  undefined4 uVar3;
  once_flag *__once;
  long *plVar4;
  string *psVar5;
  long lVar6;
  Rep *pRVar7;
  bool bVar8;
  uint32 uVar9;
  uint32 uVar10;
  int iVar11;
  ulong uVar12;
  LogMessage *pLVar13;
  ulong uVar14;
  undefined8 *puVar15;
  long *plVar16;
  ulong uVar17;
  Arena *arena;
  ulong uVar18;
  Reflection *this_00;
  InlinedStringField *string2;
  RepeatedPtrFieldBase *pRVar19;
  ArenaStringPtr *this_01;
  Arena *arena_00;
  ReflectionSchema *this_02;
  Message *__tmp;
  InlinedStringField *string1;
  RepeatedPtrFieldBase *pRVar20;
  string *this_03;
  string temp;
  FieldDescriptor *local_78;
  FieldDescriptor *local_70;
  undefined1 local_68 [56];
  
  __once = *(once_flag **)(field + 0x30);
  if (*(int *)(field + 0x3c) == 3) {
    if (__once != (once_flag *)0x0) {
      local_68._0_8_ = FieldDescriptor::TypeOnceInit;
      local_78 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (__once,(_func_void_FieldDescriptor_ptr **)local_68,&local_78);
    }
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4))
    {
    case 1:
    case 8:
      uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar10 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedField<int>::Swap
                ((RepeatedField<int> *)
                 ((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar9),
                 (RepeatedField<int> *)
                 ((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar10));
      break;
    case 2:
      uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar10 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedField<long>::Swap
                ((RepeatedField<long> *)
                 ((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar9),
                 (RepeatedField<long> *)
                 ((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar10));
      break;
    case 3:
      uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar10 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedField<unsigned_int>::Swap
                ((RepeatedField<unsigned_int> *)
                 ((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar9),
                 (RepeatedField<unsigned_int> *)
                 ((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar10));
      break;
    case 4:
      uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar10 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedField<unsigned_long>::Swap
                ((RepeatedField<unsigned_long> *)
                 ((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar9),
                 (RepeatedField<unsigned_long> *)
                 ((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar10));
      break;
    case 5:
      uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar10 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedField<double>::Swap
                ((RepeatedField<double> *)
                 ((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar9),
                 (RepeatedField<double> *)
                 ((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar10));
      break;
    case 6:
      uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar10 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedField<float>::Swap
                ((RepeatedField<float> *)
                 ((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar9),
                 (RepeatedField<float> *)
                 ((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar10));
      break;
    case 7:
      uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar10 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedField<bool>::Swap
                ((RepeatedField<bool> *)
                 ((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar9),
                 (RepeatedField<bool> *)
                 ((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar10));
      break;
    case 9:
      uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      pRVar19 = (RepeatedPtrFieldBase *)
                ((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar9);
      uVar10 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      pRVar20 = (RepeatedPtrFieldBase *)
                ((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar10);
      if (*(long *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar10) ==
          *(long *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar9)) {
        pRVar7 = pRVar19->rep_;
        pRVar19->rep_ = pRVar20->rep_;
        pRVar20->rep_ = pRVar7;
        iVar11 = pRVar19->current_size_;
        pRVar19->current_size_ = pRVar20->current_size_;
        pRVar20->current_size_ = iVar11;
        iVar11 = pRVar19->total_size_;
        pRVar19->total_size_ = pRVar20->total_size_;
        pRVar20->total_size_ = iVar11;
      }
      else {
        internal::RepeatedPtrFieldBase::
        SwapFallback<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                  (pRVar19,pRVar20);
      }
      break;
    case 10:
      bVar8 = anon_unknown_0::IsMapFieldInApi(field);
      uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      pRVar20 = (RepeatedPtrFieldBase *)
                ((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar9);
      uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      pRVar19 = (RepeatedPtrFieldBase *)
                ((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9);
      if (bVar8) {
        (*(pRVar20->arena_->impl_).options_.block_alloc)((size_t)pRVar20);
      }
      else if (pRVar19->arena_ == pRVar20->arena_) {
        pRVar7 = pRVar20->rep_;
        pRVar20->rep_ = pRVar19->rep_;
        pRVar19->rep_ = pRVar7;
        iVar11 = pRVar20->current_size_;
        pRVar20->current_size_ = pRVar19->current_size_;
        pRVar19->current_size_ = iVar11;
        iVar11 = pRVar20->total_size_;
        pRVar20->total_size_ = pRVar19->total_size_;
        pRVar19->total_size_ = iVar11;
      }
      else {
        internal::RepeatedPtrFieldBase::
        SwapFallback<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                  (pRVar20,pRVar19);
      }
      break;
    default:
      internal::LogMessage::LogMessage
                ((LogMessage *)local_68,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x193);
      pLVar13 = internal::LogMessage::operator<<((LogMessage *)local_68,"Unimplemented type: ");
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        local_78 = (FieldDescriptor *)FieldDescriptor::TypeOnceInit;
        local_70 = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_78,
                   &local_70);
      }
      pLVar13 = internal::LogMessage::operator<<
                          (pLVar13,*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                           (ulong)*(uint *)(field + 0x38) * 4));
      internal::LogFinisher::operator=((LogFinisher *)&local_78,pLVar13);
LAB_002882f5:
      internal::LogMessage::~LogMessage((LogMessage *)local_68);
    }
  }
  else {
    if (__once != (once_flag *)0x0) {
      local_68._0_8_ = FieldDescriptor::TypeOnceInit;
      local_78 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (__once,(_func_void_FieldDescriptor_ptr **)local_68,&local_78);
    }
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4))
    {
    case 1:
    case 3:
    case 8:
      uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar10 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar3 = *(undefined4 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar9)
      ;
      *(undefined4 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar9) =
           *(undefined4 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar10);
      *(undefined4 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar10) =
           uVar3;
      break;
    case 2:
    case 4:
      uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar10 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar1 = *(undefined8 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar9)
      ;
      *(undefined8 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar9) =
           *(undefined8 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar10);
      *(undefined8 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar10) =
           uVar1;
      break;
    case 5:
      uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar10 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar1 = *(undefined8 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar9)
      ;
      *(undefined8 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar9) =
           *(undefined8 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar10);
      *(undefined8 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar10) =
           uVar1;
      break;
    case 6:
      uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar10 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar3 = *(undefined4 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar9)
      ;
      *(undefined4 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar9) =
           *(undefined4 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar10);
      *(undefined4 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar10) =
           uVar3;
      break;
    case 7:
      uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar10 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar2 = *(undefined1 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar9)
      ;
      *(undefined1 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar9) =
           *(undefined1 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar10);
      *(undefined1 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar10) =
           uVar2;
      break;
    case 9:
      uVar14 = (ulong)(uint)(this->schema_).metadata_offset_;
      arena = *(Arena **)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar14);
      if (((ulong)arena & 1) != 0) {
        arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
      }
      arena_00 = *(Arena **)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar14);
      if (((ulong)arena_00 & 1) != 0) {
        arena_00 = *(Arena **)(((ulong)arena_00 & 0xfffffffffffffffe) + 0x18);
      }
      this_02 = &this->schema_;
      bVar8 = internal::ReflectionSchema::IsFieldInlined(this_02,field);
      uVar9 = internal::ReflectionSchema::GetFieldOffset(this_02,field);
      this_03 = (string *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar9);
      uVar9 = internal::ReflectionSchema::GetFieldOffset(this_02,field);
      this_01 = (ArenaStringPtr *)
                ((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9);
      if (bVar8) {
        std::__cxx11::string::swap(this_03);
      }
      else {
        puVar15 = (undefined8 *)internal::ReflectionSchema::GetFieldDefault(this_02,field);
        if (arena == arena_00) {
          psVar5 = *(string **)this_03;
          *(string **)this_03 = this_01->ptr_;
          this_01->ptr_ = psVar5;
        }
        else {
          psVar5 = (string *)*puVar15;
          lVar6 = **(long **)this_03;
          local_68._0_8_ = local_68 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_68,lVar6,(*(long **)this_03)[1] + lVar6);
          internal::ArenaStringPtr::Set((ArenaStringPtr *)this_03,psVar5,this_01->ptr_,arena);
          internal::ArenaStringPtr::Set(this_01,psVar5,(string *)local_68,arena_00);
          if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
            operator_delete((void *)local_68._0_8_);
          }
        }
      }
      break;
    case 10:
      uVar12 = (ulong)(uint)(this->schema_).metadata_offset_;
      uVar14 = *(ulong *)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar12);
      if ((uVar14 & 1) != 0) {
        uVar14 = *(ulong *)((uVar14 & 0xfffffffffffffffe) + 0x18);
      }
      uVar12 = *(ulong *)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar12);
      if ((uVar12 & 1) != 0) {
        uVar12 = *(ulong *)((uVar12 & 0xfffffffffffffffe) + 0x18);
      }
      uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar10 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar17 = (ulong)uVar9;
      uVar18 = (ulong)uVar10;
      plVar16 = *(long **)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar17);
      if (uVar14 == uVar12) {
        *(undefined8 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar17) =
             *(undefined8 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar18);
        *(long **)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar18) = plVar16;
      }
      else {
        plVar4 = *(long **)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar18);
        if (plVar16 == (long *)0x0) {
          if (plVar4 == (long *)0x0) {
            return;
          }
          iVar11 = (*(message1->super_MessageLite)._vptr_MessageLite[5])(message1);
          plVar16 = (long *)(**(code **)(*plVar4 + 0x20))(plVar4,iVar11);
          *(long **)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar17) = plVar16;
          (**(code **)(*plVar16 + 0x80))
                    (plVar16,*(undefined8 *)
                              ((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar18));
          message1 = message2;
        }
        else {
          if (plVar4 != (long *)0x0) {
            (**(code **)(*plVar16 + 0xa8))(plVar16);
            Swap(this_00,*(Message **)
                          ((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar17),
                 *(Message **)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar18));
            return;
          }
          iVar11 = (*(message2->super_MessageLite)._vptr_MessageLite[5])(message2);
          plVar16 = (long *)(**(code **)(*plVar16 + 0x20))(plVar16,iVar11);
          *(long **)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar18) = plVar16;
          (**(code **)(*plVar16 + 0x80))
                    (plVar16,*(undefined8 *)
                              ((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar17));
        }
        ClearField(this,message1,field);
      }
      break;
    default:
      internal::LogMessage::LogMessage
                ((LogMessage *)local_68,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x1e0);
      pLVar13 = internal::LogMessage::operator<<((LogMessage *)local_68,"Unimplemented type: ");
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        local_78 = (FieldDescriptor *)FieldDescriptor::TypeOnceInit;
        local_70 = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_78,
                   &local_70);
      }
      pLVar13 = internal::LogMessage::operator<<
                          (pLVar13,*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                           (ulong)*(uint *)(field + 0x38) * 4));
      internal::LogFinisher::operator=((LogFinisher *)&local_78,pLVar13);
      goto LAB_002882f5;
    }
  }
  return;
}

Assistant:

void Reflection::SwapField(Message* message1, Message* message2,
                           const FieldDescriptor* field) const {
  if (field->is_repeated()) {
    switch (field->cpp_type()) {
#define SWAP_ARRAYS(CPPTYPE, TYPE)                                 \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                         \
    MutableRaw<RepeatedField<TYPE> >(message1, field)              \
        ->Swap(MutableRaw<RepeatedField<TYPE> >(message2, field)); \
    break;

      SWAP_ARRAYS(INT32, int32);
      SWAP_ARRAYS(INT64, int64);
      SWAP_ARRAYS(UINT32, uint32);
      SWAP_ARRAYS(UINT64, uint64);
      SWAP_ARRAYS(FLOAT, float);
      SWAP_ARRAYS(DOUBLE, double);
      SWAP_ARRAYS(BOOL, bool);
      SWAP_ARRAYS(ENUM, int);
#undef SWAP_ARRAYS

      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->options().ctype()) {
          default:  // TODO(kenton):  Support other string reps.
          case FieldOptions::STRING:
            MutableRaw<RepeatedPtrFieldBase>(message1, field)
                ->Swap<GenericTypeHandler<std::string> >(
                    MutableRaw<RepeatedPtrFieldBase>(message2, field));
            break;
        }
        break;
      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (IsMapFieldInApi(field)) {
          MutableRaw<MapFieldBase>(message1, field)
              ->Swap(MutableRaw<MapFieldBase>(message2, field));
        } else {
          MutableRaw<RepeatedPtrFieldBase>(message1, field)
              ->Swap<GenericTypeHandler<Message> >(
                  MutableRaw<RepeatedPtrFieldBase>(message2, field));
        }
        break;

      default:
        GOOGLE_LOG(FATAL) << "Unimplemented type: " << field->cpp_type();
    }
  } else {
    switch (field->cpp_type()) {
#define SWAP_VALUES(CPPTYPE, TYPE)                 \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:         \
    std::swap(*MutableRaw<TYPE>(message1, field),  \
              *MutableRaw<TYPE>(message2, field)); \
    break;

      SWAP_VALUES(INT32, int32);
      SWAP_VALUES(INT64, int64);
      SWAP_VALUES(UINT32, uint32);
      SWAP_VALUES(UINT64, uint64);
      SWAP_VALUES(FLOAT, float);
      SWAP_VALUES(DOUBLE, double);
      SWAP_VALUES(BOOL, bool);
      SWAP_VALUES(ENUM, int);
#undef SWAP_VALUES
      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (GetArena(message1) == GetArena(message2)) {
          std::swap(*MutableRaw<Message*>(message1, field),
                    *MutableRaw<Message*>(message2, field));
        } else {
          Message** sub_msg1 = MutableRaw<Message*>(message1, field);
          Message** sub_msg2 = MutableRaw<Message*>(message2, field);
          if (*sub_msg1 == nullptr && *sub_msg2 == nullptr) break;
          if (*sub_msg1 && *sub_msg2) {
            (*sub_msg1)->GetReflection()->Swap(*sub_msg1, *sub_msg2);
            break;
          }
          if (*sub_msg1 == nullptr) {
            *sub_msg1 = (*sub_msg2)->New(message1->GetArena());
            (*sub_msg1)->CopyFrom(**sub_msg2);
            ClearField(message2, field);
          } else {
            *sub_msg2 = (*sub_msg1)->New(message2->GetArena());
            (*sub_msg2)->CopyFrom(**sub_msg1);
            ClearField(message1, field);
          }
        }
        break;

      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->options().ctype()) {
          default:  // TODO(kenton):  Support other string reps.
          case FieldOptions::STRING: {
            Arena* arena1 = GetArena(message1);
            Arena* arena2 = GetArena(message2);

            if (IsInlined(field)) {
              InlinedStringField* string1 =
                  MutableRaw<InlinedStringField>(message1, field);
              InlinedStringField* string2 =
                  MutableRaw<InlinedStringField>(message2, field);
              string1->Swap(string2);
              break;
            }

            ArenaStringPtr* string1 =
                MutableRaw<ArenaStringPtr>(message1, field);
            ArenaStringPtr* string2 =
                MutableRaw<ArenaStringPtr>(message2, field);
            const std::string* default_ptr =
                &DefaultRaw<ArenaStringPtr>(field).Get();
            if (arena1 == arena2) {
              string1->Swap(string2, default_ptr, arena1);
            } else {
              const std::string temp = string1->Get();
              string1->Set(default_ptr, string2->Get(), arena1);
              string2->Set(default_ptr, temp, arena2);
            }
          } break;
        }
        break;

      default:
        GOOGLE_LOG(FATAL) << "Unimplemented type: " << field->cpp_type();
    }
  }
}